

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

bool __thiscall
duckdb::Pipeline::ScheduleParallel(Pipeline *this,shared_ptr<duckdb::Event,_true> *event)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  PhysicalOperator *pPVar4;
  undefined8 uVar5;
  pointer pGVar6;
  undefined4 extraout_var;
  unsigned_long uVar7;
  pointer pGVar8;
  Pipeline *in_RDI;
  unsigned_long active_threads;
  TaskScheduler *scheduler;
  idx_t max_threads;
  OperatorPartitionInfo partition_info;
  PhysicalOperator *op;
  reference_wrapper<duckdb::PhysicalOperator> *op_ref;
  iterator __end1;
  iterator __begin1;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *__range1;
  string *in_stack_fffffffffffffea8;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  TaskScheduler *in_stack_fffffffffffffeb8;
  undefined6 in_stack_ffffffffffffff18;
  byte in_stack_ffffffffffffff1e;
  byte in_stack_ffffffffffffff1f;
  PhysicalOperator *in_stack_ffffffffffffff20;
  ulong local_c0;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [48];
  byte local_60 [32];
  PhysicalOperator *local_40;
  reference local_38;
  reference_wrapper<duckdb::PhysicalOperator> *local_30;
  __normal_iterator<std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
  local_28;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *local_20;
  byte local_1;
  
  pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->
                     ((optional_ptr<duckdb::PhysicalOperator,_true> *)
                      CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  uVar2 = (*pPVar4->_vptr_PhysicalOperator[0x22])();
  if ((uVar2 & 1) == 0) {
    local_1 = 0;
  }
  else {
    pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->
                       ((optional_ptr<duckdb::PhysicalOperator,_true> *)
                        CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
    uVar2 = (*pPVar4->_vptr_PhysicalOperator[0x14])();
    if ((uVar2 & 1) == 0) {
      local_1 = 0;
    }
    else {
      local_20 = &in_RDI->operators;
      local_28._M_current =
           (reference_wrapper<duckdb::PhysicalOperator> *)
           ::std::
           vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
           ::begin((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                    *)in_stack_fffffffffffffea8);
      local_30 = (reference_wrapper<duckdb::PhysicalOperator> *)
                 ::std::
                 vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                 ::end((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                        *)in_stack_fffffffffffffea8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                                (__normal_iterator<std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
                                 *)in_stack_fffffffffffffea8), bVar1) {
        local_38 = __gnu_cxx::
                   __normal_iterator<std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
                   ::operator*(&local_28);
        local_40 = ::std::reference_wrapper<duckdb::PhysicalOperator>::get(local_38);
        uVar2 = (*local_40->_vptr_PhysicalOperator[0xc])();
        if ((uVar2 & 1) == 0) {
          local_1 = 0;
          goto LAB_00996c53;
        }
        __gnu_cxx::
        __normal_iterator<std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
        ::operator++(&local_28);
      }
      pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->
                         ((optional_ptr<duckdb::PhysicalOperator,_true> *)
                          CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      (*pPVar4->_vptr_PhysicalOperator[0x23])(local_60);
      if ((local_60[0] & 1) != 0) {
        in_stack_ffffffffffffff20 =
             optional_ptr<duckdb::PhysicalOperator,_true>::operator->
                       ((optional_ptr<duckdb::PhysicalOperator,_true> *)
                        CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
        OperatorPartitionInfo::BatchIndex();
        iVar3 = (*in_stack_ffffffffffffff20->_vptr_PhysicalOperator[0x15])
                          (in_stack_ffffffffffffff20,local_90);
        in_stack_ffffffffffffff1f = (byte)iVar3;
        in_stack_ffffffffffffff1e = in_stack_ffffffffffffff1f ^ 0xff;
        OperatorPartitionInfo::~OperatorPartitionInfo((OperatorPartitionInfo *)0x99695e);
        if ((in_stack_ffffffffffffff1e & 1) != 0) {
          uVar5 = __cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_b0,
                     "Attempting to schedule a pipeline where the sink requires batch index but source does not support it"
                     ,&local_b1);
          InternalException::InternalException
                    ((InternalException *)
                     CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0),
                     in_stack_fffffffffffffea8);
          __cxa_throw(uVar5,&InternalException::typeinfo,InternalException::~InternalException);
        }
      }
      pGVar6 = unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
               ::operator->((unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
                             *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
      iVar3 = (*pGVar6->_vptr_GlobalSourceState[2])();
      TaskScheduler::GetScheduler((ClientContext *)0x996ad6);
      TaskScheduler::NumberOfThreads(in_stack_fffffffffffffeb8);
      uVar7 = NumericCast<unsigned_long,int,void>(0);
      local_c0 = CONCAT44(extraout_var,iVar3);
      if (uVar7 < CONCAT44(extraout_var,iVar3)) {
        local_c0 = uVar7;
      }
      bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&in_RDI->sink);
      if (bVar1) {
        optional_ptr<duckdb::PhysicalOperator,_true>::operator->
                  ((optional_ptr<duckdb::PhysicalOperator,_true> *)
                   CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
        bVar1 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>
                            *)0x996b86);
        if (bVar1) {
          optional_ptr<duckdb::PhysicalOperator,_true>::operator->
                    ((optional_ptr<duckdb::PhysicalOperator,_true> *)
                     CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
          pGVar8 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                   ::operator->((unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                                 *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
          (*pGVar8->_vptr_GlobalSinkState[2])(pGVar8,local_c0);
        }
      }
      local_1 = LaunchScanTasks(in_RDI,(shared_ptr<duckdb::Event,_true> *)in_stack_ffffffffffffff20,
                                CONCAT17(in_stack_ffffffffffffff1f,
                                         CONCAT16(in_stack_ffffffffffffff1e,
                                                  in_stack_ffffffffffffff18)));
      OperatorPartitionInfo::~OperatorPartitionInfo((OperatorPartitionInfo *)0x996c42);
    }
  }
LAB_00996c53:
  return (bool)(local_1 & 1);
}

Assistant:

bool Pipeline::ScheduleParallel(shared_ptr<Event> &event) {
	// check if the sink, source and all intermediate operators support parallelism
	if (!sink->ParallelSink()) {
		return false;
	}
	if (!source->ParallelSource()) {
		return false;
	}
	for (auto &op_ref : operators) {
		auto &op = op_ref.get();
		if (!op.ParallelOperator()) {
			return false;
		}
	}
	auto partition_info = sink->RequiredPartitionInfo();
	if (partition_info.batch_index) {
		if (!source->SupportsPartitioning(OperatorPartitionInfo::BatchIndex())) {
			throw InternalException(
			    "Attempting to schedule a pipeline where the sink requires batch index but source does not support it");
		}
	}
	auto max_threads = source_state->MaxThreads();
	auto &scheduler = TaskScheduler::GetScheduler(executor.context);
	auto active_threads = NumericCast<idx_t>(scheduler.NumberOfThreads());
	if (max_threads > active_threads) {
		max_threads = active_threads;
	}
	if (sink && sink->sink_state) {
		max_threads = sink->sink_state->MaxThreads(max_threads);
	}
	if (max_threads > active_threads) {
		max_threads = active_threads;
	}
	return LaunchScanTasks(event, max_threads);
}